

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rollup.c
# Opt level: O2

int main(int argc,char **argv)

{
  vtt_block_t *pvVar1;
  int iVar2;
  flvtag_avcpackettype_t fVar3;
  FILE *flv;
  FILE *flv_00;
  srt_t *vtt;
  char **ppcVar4;
  double dVar5;
  int has_video;
  int has_audio;
  double local_48;
  flvtag_t tag;
  
  flv = flv_open_read(argv[1]);
  flv_00 = flv_open_write(argv[2]);
  flvtag_init(&tag);
  vtt = srt_new();
  for (ppcVar4 = wonderland; **ppcVar4 != '\0'; ppcVar4 = ppcVar4 + 1) {
    append_caption(*ppcVar4,vtt);
  }
  iVar2 = flv_read_header(flv,&has_audio,&has_video);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s is not an flv file\n",argv[1]);
    iVar2 = 1;
  }
  else {
    flv_write_header(flv_00,has_audio,has_video);
    while( true ) {
      iVar2 = flv_read_tag(flv,&tag);
      if (iVar2 == 0) break;
      pvVar1 = vtt->cue_head;
      if (pvVar1 != (vtt_block_t *)0x0) {
        fVar3 = flvtag_avcpackettype(&tag);
        if (fVar3 == flvtag_avcpackettype_nalu) {
          local_48 = pvVar1->timestamp;
          dVar5 = flvtag_pts_seconds(&tag);
          if (local_48 <= dVar5) {
            fprintf(_stderr,"%f %s\n",pvVar1 + 1);
            flvtag_addcaption_text(&tag,(utf8_char_t *)(vtt->cue_head + 1));
            vtt_cue_free_head(vtt);
          }
        }
      }
      flv_write_tag(flv_00,&tag);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
    int i = 0;
    flvtag_t tag;
    srt_t* srt = 0;
    int has_audio, has_video;
    FILE* flv = flv_open_read(argv[1]);
    FILE* out = flv_open_write(argv[2]);
    flvtag_init(&tag);

    srt = srt_new();

    for (i = 0; wonderland[i][0]; ++i) {
        append_caption(wonderland[i], srt);
    }

    if (!flv_read_header(flv, &has_audio, &has_video)) {
        fprintf(stderr, "%s is not an flv file\n", argv[1]);
        return EXIT_FAILURE;
    }

    flv_write_header(out, has_audio, has_video);

    while (flv_read_tag(flv, &tag)) {
        if (srt->cue_head && flvtag_avcpackettype_nalu == flvtag_avcpackettype(&tag) && srt->cue_head->timestamp <= flvtag_pts_seconds(&tag)) {
            fprintf(stderr, "%f %s\n", flvtag_pts_seconds(&tag), srt_cue_data(srt->cue_head));
            flvtag_addcaption_text(&tag, srt_cue_data(srt->cue_head));
            srt_cue_free_head(srt);
        }

        flv_write_tag(out, &tag);
    }

    return EXIT_SUCCESS;
}